

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O1

int __thiscall
gl4cts::SparseTextureAllocationTestCase::init
          (SparseTextureAllocationTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  iterator iVar2;
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int extraout_EAX_11;
  int extraout_EAX_12;
  int extraout_EAX_13;
  int extraout_EAX_14;
  int extraout_EAX_15;
  int extraout_EAX_16;
  int extraout_EAX_17;
  int extraout_EAX_18;
  int extraout_EAX_19;
  int extraout_EAX_20;
  int extraout_EAX_21;
  int extraout_EAX_22;
  int extraout_EAX_23;
  int extraout_EAX_24;
  int extraout_EAX_25;
  int extraout_EAX_26;
  int extraout_EAX_27;
  int extraout_EAX_28;
  int extraout_EAX_29;
  int extraout_EAX_30;
  int extraout_EAX_31;
  int extraout_EAX_32;
  int extraout_EAX_33;
  int extraout_EAX_34;
  int extraout_EAX_35;
  int extraout_EAX_36;
  int extraout_EAX_37;
  int extraout_EAX_38;
  int extraout_EAX_39;
  int extraout_EAX_40;
  int extraout_EAX_41;
  int extraout_EAX_42;
  int extraout_EAX_43;
  int extraout_EAX_44;
  int extraout_EAX_45;
  int extraout_EAX_46;
  int extraout_EAX_47;
  int extraout_EAX_48;
  int local_14;
  
  pvVar1 = &this->mSupportedTargets;
  iVar2._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX;
  }
  else {
    *iVar2._M_current = 0xde1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_00;
  }
  else {
    *iVar2._M_current = 0x8c1a;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_01;
  }
  else {
    *iVar2._M_current = 0x8513;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_02;
  }
  else {
    *iVar2._M_current = 0x9009;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_03;
  }
  else {
    *iVar2._M_current = 0x806f;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_04;
  }
  else {
    *iVar2._M_current = 0x84f5;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pvVar1 = &this->mFullArrayTargets;
  iVar2._M_current =
       (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_05;
  }
  else {
    *iVar2._M_current = 0x8c18;
    (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_06;
  }
  else {
    *iVar2._M_current = 0x8c1a;
    (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_07;
  }
  else {
    *iVar2._M_current = 0x8513;
    (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_08;
  }
  else {
    *iVar2._M_current = 0x9009;
    (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pvVar1 = &this->mSupportedInternalFormats;
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_09;
  }
  else {
    *iVar2._M_current = 0x8229;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_10;
  }
  else {
    *iVar2._M_current = 0x8f94;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_11;
  }
  else {
    *iVar2._M_current = 0x822a;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_12;
  }
  else {
    *iVar2._M_current = 0x8f98;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_13;
  }
  else {
    *iVar2._M_current = 0x822b;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_14;
  }
  else {
    *iVar2._M_current = 0x8f95;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_15;
  }
  else {
    *iVar2._M_current = 0x822c;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_16;
  }
  else {
    *iVar2._M_current = 0x8f99;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_17;
  }
  else {
    *iVar2._M_current = 0x8d62;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_18;
  }
  else {
    *iVar2._M_current = 0x8058;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_19;
  }
  else {
    *iVar2._M_current = 0x8f97;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_20;
  }
  else {
    *iVar2._M_current = 0x8059;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_21;
  }
  else {
    *iVar2._M_current = 0x906f;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_22;
  }
  else {
    *iVar2._M_current = 0x805b;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_23;
  }
  else {
    *iVar2._M_current = 0x8f9b;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_24;
  }
  else {
    *iVar2._M_current = 0x822d;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_25;
  }
  else {
    *iVar2._M_current = 0x822f;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_26;
  }
  else {
    *iVar2._M_current = 0x881a;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_27;
  }
  else {
    *iVar2._M_current = 0x822e;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_28;
  }
  else {
    *iVar2._M_current = 0x8230;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_29;
  }
  else {
    *iVar2._M_current = 0x8814;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_30;
  }
  else {
    *iVar2._M_current = 0x8c3a;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_31;
  }
  else {
    *iVar2._M_current = 0x8c3d;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_32;
  }
  else {
    *iVar2._M_current = 0x8231;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_33;
  }
  else {
    *iVar2._M_current = 0x8232;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_34;
  }
  else {
    *iVar2._M_current = 0x8233;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_35;
  }
  else {
    *iVar2._M_current = 0x8234;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_36;
  }
  else {
    *iVar2._M_current = 0x8235;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_37;
  }
  else {
    *iVar2._M_current = 0x8236;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_38;
  }
  else {
    *iVar2._M_current = 0x8237;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_39;
  }
  else {
    *iVar2._M_current = 0x8238;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_40;
  }
  else {
    *iVar2._M_current = 0x8239;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_41;
  }
  else {
    *iVar2._M_current = 0x823a;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_42;
  }
  else {
    *iVar2._M_current = 0x823b;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_43;
  }
  else {
    *iVar2._M_current = 0x823c;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_44;
  }
  else {
    *iVar2._M_current = 0x8d8e;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_45;
  }
  else {
    *iVar2._M_current = 0x8d7c;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_46;
  }
  else {
    *iVar2._M_current = 0x8d88;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_47;
  }
  else {
    *iVar2._M_current = 0x8d76;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar2,&local_14);
    in_EAX = extraout_EAX_48;
  }
  else {
    *iVar2._M_current = 0x8d82;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  return in_EAX;
}

Assistant:

void SparseTextureAllocationTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_3D);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);

	mFullArrayTargets.push_back(GL_TEXTURE_1D_ARRAY);
	mFullArrayTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mFullArrayTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mFullArrayTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);

	mSupportedInternalFormats.push_back(GL_R8);
	mSupportedInternalFormats.push_back(GL_R8_SNORM);
	mSupportedInternalFormats.push_back(GL_R16);
	mSupportedInternalFormats.push_back(GL_R16_SNORM);
	mSupportedInternalFormats.push_back(GL_RG8);
	mSupportedInternalFormats.push_back(GL_RG8_SNORM);
	mSupportedInternalFormats.push_back(GL_RG16);
	mSupportedInternalFormats.push_back(GL_RG16_SNORM);
	mSupportedInternalFormats.push_back(GL_RGB565);
	mSupportedInternalFormats.push_back(GL_RGBA8);
	mSupportedInternalFormats.push_back(GL_RGBA8_SNORM);
	mSupportedInternalFormats.push_back(GL_RGB10_A2);
	mSupportedInternalFormats.push_back(GL_RGB10_A2UI);
	mSupportedInternalFormats.push_back(GL_RGBA16);
	mSupportedInternalFormats.push_back(GL_RGBA16_SNORM);
	mSupportedInternalFormats.push_back(GL_R16F);
	mSupportedInternalFormats.push_back(GL_RG16F);
	mSupportedInternalFormats.push_back(GL_RGBA16F);
	mSupportedInternalFormats.push_back(GL_R32F);
	mSupportedInternalFormats.push_back(GL_RG32F);
	mSupportedInternalFormats.push_back(GL_RGBA32F);
	mSupportedInternalFormats.push_back(GL_R11F_G11F_B10F);
	mSupportedInternalFormats.push_back(GL_RGB9_E5);
	mSupportedInternalFormats.push_back(GL_R8I);
	mSupportedInternalFormats.push_back(GL_R8UI);
	mSupportedInternalFormats.push_back(GL_R16I);
	mSupportedInternalFormats.push_back(GL_R16UI);
	mSupportedInternalFormats.push_back(GL_R32I);
	mSupportedInternalFormats.push_back(GL_R32UI);
	mSupportedInternalFormats.push_back(GL_RG8I);
	mSupportedInternalFormats.push_back(GL_RG8UI);
	mSupportedInternalFormats.push_back(GL_RG16I);
	mSupportedInternalFormats.push_back(GL_RG16UI);
	mSupportedInternalFormats.push_back(GL_RG32I);
	mSupportedInternalFormats.push_back(GL_RG32UI);
	mSupportedInternalFormats.push_back(GL_RGBA8I);
	mSupportedInternalFormats.push_back(GL_RGBA8UI);
	mSupportedInternalFormats.push_back(GL_RGBA16I);
	mSupportedInternalFormats.push_back(GL_RGBA16UI);
	mSupportedInternalFormats.push_back(GL_RGBA32I);
}